

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O2

void printsub(Curl_easy *data,int direction,uchar *pointer,size_t length)

{
  byte bVar1;
  byte bVar2;
  uchar uVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  char *fmt;
  ulong uVar7;
  
  if ((data->set).verbose != true) {
    return;
  }
  pcVar6 = "SENT";
  if (direction == 0x3c) {
    pcVar6 = "RCVD";
  }
  Curl_infof(data,"%s IAC SB ",pcVar6);
  if (length < 3) {
    if (length == 2) {
      pcVar6 = "(Empty suboption?)";
      goto LAB_0012a70a;
    }
    uVar4 = 0;
  }
  else {
    bVar1 = pointer[length - 2];
    uVar4 = (ulong)bVar1;
    bVar2 = pointer[length - 1];
    if (bVar2 != 0xf0 || bVar1 != 0xff) {
      Curl_infof(data,"(terminated by ");
      if (bVar1 < 0x28) {
        pcVar6 = telnetoptions[uVar4];
LAB_0012a517:
        Curl_infof(data,"%s ",pcVar6);
      }
      else {
        if (0xeb < bVar1) {
          pcVar6 = telnetcmds[bVar1 - 0xec];
          goto LAB_0012a517;
        }
        Curl_infof(data,"%u ",(ulong)bVar1);
      }
      if (bVar2 < 0x28) {
        pcVar6 = telnetoptions[bVar2];
LAB_0012a56e:
        Curl_infof(data,"%s",pcVar6);
      }
      else {
        if (0xeb < bVar2) {
          pcVar6 = telnetcmds[bVar2 - 0xec];
          goto LAB_0012a56e;
        }
        Curl_infof(data,"%d");
      }
      Curl_infof(data,", not IAC SE!) ");
    }
  }
  uVar7 = length - 2;
  uVar5 = (ulong)*pointer;
  if (uVar5 < 0x28) {
    if ((*pointer < 0x28) && ((0x8881000000U >> (uVar5 & 0x3f) & 1) != 0)) {
      pcVar6 = telnetoptions[uVar5];
      fmt = "%s";
    }
    else {
      pcVar6 = telnetoptions[uVar5];
      fmt = "%s (unsupported)";
    }
    Curl_infof(data,fmt,pcVar6);
  }
  else {
    Curl_infof(data,"%d (unknown)",(ulong)pointer[uVar4]);
  }
  uVar3 = *pointer;
  if (uVar3 == '\x1f') {
    if (4 < uVar7) {
      Curl_infof(data,"Width: %hu ; Height: %hu",
                 (ulong)(ushort)(*(ushort *)(pointer + 1) << 8 | *(ushort *)(pointer + 1) >> 8),
                 (ulong)(ushort)(*(ushort *)(pointer + 3) << 8 | *(ushort *)(pointer + 3) >> 8));
    }
  }
  else {
    if ((ulong)pointer[1] < 4) {
      Curl_infof(data,&DAT_0014b450 + *(int *)(&DAT_0014b450 + (ulong)pointer[1] * 4));
      uVar3 = *pointer;
    }
    if ((uVar3 == '\x18') || (uVar3 == '#')) {
      pointer[uVar7] = '\0';
      Curl_infof(data," \"%s\"",pointer + 2);
    }
    else if (uVar3 == '\'') {
      if (pointer[1] == '\0') {
        Curl_infof(data," ");
        for (uVar4 = 3; uVar4 < uVar7; uVar4 = (ulong)((int)uVar4 + 1)) {
          if (pointer[uVar4] == '\x01') {
            pcVar6 = " = ";
LAB_0012a6ce:
            Curl_infof(data,pcVar6);
          }
          else {
            if (pointer[uVar4] == '\0') {
              pcVar6 = ", ";
              goto LAB_0012a6ce;
            }
            Curl_infof(data,"%c");
          }
        }
      }
    }
    else {
      for (uVar4 = 2; uVar4 < uVar7; uVar4 = (ulong)((int)uVar4 + 1)) {
        Curl_infof(data," %.2x",(ulong)pointer[uVar4]);
      }
    }
  }
  pcVar6 = "\n";
LAB_0012a70a:
  Curl_infof(data,pcVar6);
  return;
}

Assistant:

static void printsub(struct Curl_easy *data,
                     int direction,             /* '<' or '>' */
                     unsigned char *pointer,    /* where suboption data is */
                     size_t length)             /* length of suboption data */
{
  unsigned int i = 0;

  if(data->set.verbose) {
    if(direction) {
      infof(data, "%s IAC SB ", (direction == '<')? "RCVD":"SENT");
      if(length >= 3) {
        int j;

        i = pointer[length-2];
        j = pointer[length-1];

        if(i != CURL_IAC || j != CURL_SE) {
          infof(data, "(terminated by ");
          if(CURL_TELOPT_OK(i))
            infof(data, "%s ", CURL_TELOPT(i));
          else if(CURL_TELCMD_OK(i))
            infof(data, "%s ", CURL_TELCMD(i));
          else
            infof(data, "%u ", i);
          if(CURL_TELOPT_OK(j))
            infof(data, "%s", CURL_TELOPT(j));
          else if(CURL_TELCMD_OK(j))
            infof(data, "%s", CURL_TELCMD(j));
          else
            infof(data, "%d", j);
          infof(data, ", not IAC SE!) ");
        }
      }
      length -= 2;
    }
    if(length < 1) {
      infof(data, "(Empty suboption?)");
      return;
    }

    if(CURL_TELOPT_OK(pointer[0])) {
      switch(pointer[0]) {
      case CURL_TELOPT_TTYPE:
      case CURL_TELOPT_XDISPLOC:
      case CURL_TELOPT_NEW_ENVIRON:
      case CURL_TELOPT_NAWS:
        infof(data, "%s", CURL_TELOPT(pointer[0]));
        break;
      default:
        infof(data, "%s (unsupported)", CURL_TELOPT(pointer[0]));
        break;
      }
    }
    else
      infof(data, "%d (unknown)", pointer[i]);

    switch(pointer[0]) {
    case CURL_TELOPT_NAWS:
      if(length > 4)
        infof(data, "Width: %hu ; Height: %hu", (pointer[1]<<8) | pointer[2],
              (pointer[3]<<8) | pointer[4]);
      break;
    default:
      switch(pointer[1]) {
      case CURL_TELQUAL_IS:
        infof(data, " IS");
        break;
      case CURL_TELQUAL_SEND:
        infof(data, " SEND");
        break;
      case CURL_TELQUAL_INFO:
        infof(data, " INFO/REPLY");
        break;
      case CURL_TELQUAL_NAME:
        infof(data, " NAME");
        break;
      }

      switch(pointer[0]) {
      case CURL_TELOPT_TTYPE:
      case CURL_TELOPT_XDISPLOC:
        pointer[length] = 0;
        infof(data, " \"%s\"", &pointer[2]);
        break;
      case CURL_TELOPT_NEW_ENVIRON:
        if(pointer[1] == CURL_TELQUAL_IS) {
          infof(data, " ");
          for(i = 3;i < length;i++) {
            switch(pointer[i]) {
            case CURL_NEW_ENV_VAR:
              infof(data, ", ");
              break;
            case CURL_NEW_ENV_VALUE:
              infof(data, " = ");
              break;
            default:
              infof(data, "%c", pointer[i]);
              break;
            }
          }
        }
        break;
      default:
        for(i = 2; i < length; i++)
          infof(data, " %.2x", pointer[i]);
        break;
      }
    }
    if(direction)
      infof(data, "\n");
  }
}